

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O2

UnicodeString *
icu_63::TimeZoneFormat::formatOffsetWithAsciiDigits
          (int32_t offset,UChar sep,OffsetFields minFields,OffsetFields maxFields,
          UnicodeString *result)

{
  int iVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int fields [3];
  
  uVar4 = -offset;
  if (0 < offset) {
    uVar4 = offset;
  }
  UnicodeString::setTo(result,(short)(offset >> 0x1f) * -2 + L'+');
  fields[0] = uVar4 / 3600000;
  fields[1] = (uVar4 % 3600000) / 60000;
  fields[2] = ((uVar4 % 3600000) % 60000) / 1000;
  lVar2 = (long)(int)maxFields;
  lVar3 = (long)(int)minFields;
  if ((int)maxFields < (int)minFields) {
    minFields = maxFields;
  }
  do {
    if (lVar2 <= lVar3) {
LAB_001fee66:
      for (lVar2 = 0; lVar2 <= (int)minFields; lVar2 = lVar2 + 1) {
        if (lVar2 != 0 && sep != L'\0') {
          UnicodeString::append(result,sep);
        }
        iVar1 = fields[lVar2];
        UnicodeString::append(result,(short)(iVar1 / 10) + L'0');
        UnicodeString::append(result,(short)(iVar1 % 10) + L'0');
      }
      return result;
    }
    if (fields[lVar2] != 0) {
      minFields = (OffsetFields)lVar2;
      goto LAB_001fee66;
    }
    lVar2 = lVar2 + -1;
  } while( true );
}

Assistant:

UnicodeString&
TimeZoneFormat::formatOffsetWithAsciiDigits(int32_t offset, UChar sep, OffsetFields minFields, OffsetFields maxFields, UnicodeString& result) {
    U_ASSERT(maxFields >= minFields);
    U_ASSERT(offset > -MAX_OFFSET && offset < MAX_OFFSET);

    UChar sign = PLUS;
    if (offset < 0) {
        sign = MINUS;
        offset = -offset;
    }
    result.setTo(sign);

    int fields[3];
    fields[0] = offset / MILLIS_PER_HOUR;
    offset = offset % MILLIS_PER_HOUR;
    fields[1] = offset / MILLIS_PER_MINUTE;
    offset = offset % MILLIS_PER_MINUTE;
    fields[2] = offset / MILLIS_PER_SECOND;

    U_ASSERT(fields[0] >= 0 && fields[0] <= MAX_OFFSET_HOUR);
    U_ASSERT(fields[1] >= 0 && fields[1] <= MAX_OFFSET_MINUTE);
    U_ASSERT(fields[2] >= 0 && fields[2] <= MAX_OFFSET_SECOND);

    int32_t lastIdx = maxFields;
    while (lastIdx > minFields) {
        if (fields[lastIdx] != 0) {
            break;
        }
        lastIdx--;
    }

    for (int32_t idx = 0; idx <= lastIdx; idx++) {
        if (sep && idx != 0) {
            result.append(sep);
        }
        result.append((UChar)(0x0030 + fields[idx]/10));
        result.append((UChar)(0x0030 + fields[idx]%10));
    }

    return result;
}